

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_join_internal.h
# Opt level: O2

string * __thiscall
absl::lts_20250127::strings_internal::
JoinAlgorithm<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,absl::lts_20250127::strings_internal::AlphaNumFormatterImpl>
          (string *__return_storage_ptr__,strings_internal *this,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> start,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end,string_view s,
          AlphaNumFormatterImpl *f)

{
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> it;
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar1 = anon_var_dwarf_651463 + 5;
  for (; this != (strings_internal *)start._M_current; this = this + 4) {
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)pcVar1);
    AlphaNumFormatterImpl::operator()
              ((AlphaNumFormatterImpl *)s._M_str,__return_storage_ptr__,(int *)this);
    pcVar1 = (char *)s._M_len;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JoinAlgorithm(Iterator start, Iterator end, absl::string_view s,
                          Formatter&& f) {
  std::string result;
  absl::string_view sep("");
  for (Iterator it = start; it != end; ++it) {
    result.append(sep.data(), sep.size());
    f(&result, *it);
    sep = s;
  }
  return result;
}